

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp2.c
# Opt level: O0

void ssh2_bpp_handle_input(BinaryPacketProtocol *bpp)

{
  PacketLogSettings *pls;
  LogContext *ctx;
  _Bool _Var1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  int *s_00;
  ssh_cipheralg *psVar5;
  ssh2_macalg *psVar6;
  void *pvVar7;
  PacketQueueNode *pPVar8;
  PacketQueueNode *pPVar9;
  char *texttype;
  PktIn *pPVar10;
  ptrlen pVar11;
  int local_c0;
  int prev_type;
  int type;
  undefined1 local_98 [4];
  int nblanks;
  logblank_t blanks [4];
  PktIn *old_pktin;
  uchar *puStack_40;
  int newlen;
  uchar *newpayload;
  undefined1 local_2f;
  _Bool success_5;
  _Bool success_4;
  _Bool success_3;
  uchar len [4];
  _Bool success_2;
  _Bool success_1;
  _Bool success;
  uint buflimit;
  int *crLine;
  ssh2_bpp_state *s;
  BinaryPacketProtocol *bpp_local;
  
  s_00 = &bpp[-2].remote_bugs;
  iVar3 = *s_00;
  unique0x10003470 = s_00;
  if (iVar3 != 0) {
    if (iVar3 == 0x149) goto LAB_00123a84;
    if (iVar3 == 0x152) goto LAB_00123b25;
    if (iVar3 == 0x17d) goto LAB_00123da6;
    if (iVar3 == 0x1a9) goto LAB_00123f97;
    if (iVar3 == 0x1c2) goto LAB_001240ff;
    if (iVar3 == 0x1eb) goto LAB_001242cc;
    if (iVar3 != 0x272) {
      if (iVar3 != 0x2c9) {
        *s_00 = 0;
        return;
      }
LAB_00124a6d:
      pPVar10 = (*(bpp->in_pq).after)(&(bpp->in_pq).pqb,(PacketQueueNode *)&bpp->in_pq,false);
      if (pPVar10 != (PktIn *)0x0) {
        return;
      }
      if ((bpp->expect_close & 1U) == 0) {
        ssh_remote_error(bpp->ssh,"Remote side unexpectedly closed network connection");
        return;
      }
      ssh_remote_eof(bpp->ssh,"Remote side closed network connection");
      return;
    }
    if ((bpp[-1].ic_out_pq.field_0x11 & 1) != 0) {
      return;
    }
  }
LAB_00123929:
  bpp[-1].in_pq.pqb.end.formal_size = 0;
  bpp[-1].in_pq.pqb.end.prev = (PacketQueueNode *)0x0;
  if (bpp[-1].out_pq.pqb.total_size == 0) {
    *(undefined4 *)&bpp[-1].in_pq.after = 8;
  }
  else {
    psVar5 = ssh_cipher_alg((ssh_cipher *)bpp[-1].out_pq.pqb.total_size);
    *(int *)&bpp[-1].in_pq.after = psVar5->blksize;
  }
  if (*(uint *)&bpp[-1].in_pq.after < 8) {
    *(undefined4 *)&bpp[-1].in_pq.after = 8;
  }
  if (bpp[-1].out_pq.pqb.ic == (IdempotentCallback *)0x0) {
    local_c0 = 0;
  }
  else {
    psVar6 = ssh2_mac_alg((ssh2_mac *)bpp[-1].out_pq.pqb.ic);
    local_c0 = psVar6->len;
  }
  bpp[-1].in_pq.pqb.end.next = (PacketQueueNode *)(long)local_c0;
  if ((((bpp[-1].out_pq.pqb.total_size == 0) ||
       (psVar5 = ssh_cipher_alg((ssh_cipher *)bpp[-1].out_pq.pqb.total_size),
       (psVar5->flags & 1) == 0)) || (bpp[-1].out_pq.pqb.ic == (IdempotentCallback *)0x0)) ||
     (((ulong)bpp[-1].out_pq.after & 1) != 0)) {
    if ((bpp[-1].out_pq.pqb.ic != (IdempotentCallback *)0x0) &&
       (((ulong)bpp[-1].out_pq.after & 1) != 0)) {
      if (bpp[-1].in_pq.pqb.total_size < 4) {
        bpp[-1].in_pq.pqb.total_size = 4;
        pvVar7 = saferealloc(*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue,
                             bpp[-1].in_pq.pqb.total_size,1);
        *(void **)&bpp[-1].in_pq.pqb.end.on_free_queue = pvVar7;
      }
      *stack0xffffffffffffffd8 = 0x17d;
LAB_00123da6:
      local_2f = bufchain_try_fetch_consume
                           (bpp->in_raw,*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue,4);
      if ((!(bool)local_2f) && ((bpp->input_eof & 1U) == 0)) {
        return;
      }
      if ((bool)local_2f) {
        ssh_check_frozen(bpp->ssh);
        if ((bpp[-1].out_pq.pqb.total_size == 0) ||
           (psVar5 = ssh_cipher_alg((ssh_cipher *)bpp[-1].out_pq.pqb.total_size),
           (psVar5->flags & 2) == 0)) {
          uVar2 = GET_32BIT_MSB_FIRST(*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue);
          iVar3 = toint(uVar2);
          bpp[-1].vt = (BinaryPacketProtocolVtable *)(long)iVar3;
        }
        else {
          unique0x00011f80 = **(undefined4 **)&bpp[-1].in_pq.pqb.end.on_free_queue;
          ssh_cipher_decrypt_length
                    ((ssh_cipher *)bpp[-1].out_pq.pqb.total_size,(void *)((long)&newpayload + 5),4,
                     *(unsigned_long *)&bpp[-1].out_pq.pqb.end.on_free_queue);
          uVar2 = GET_32BIT_MSB_FIRST((void *)((long)&newpayload + 5));
          iVar3 = toint(uVar2);
          bpp[-1].vt = (BinaryPacketProtocolVtable *)(long)iVar3;
        }
        if ((((long)bpp[-1].vt < 0) || (0x9000 < (long)bpp[-1].vt)) ||
           ((long)bpp[-1].vt % (long)(ulong)*(uint *)&bpp[-1].in_pq.after != 0)) {
          ssh_sw_abort(bpp->ssh,"Incoming packet length field was garbled");
          *stack0xffffffffffffffd8 = 0;
          return;
        }
        *(undefined1 **)&bpp[-1].input_eof = (undefined1 *)((long)&(bpp[-1].vt)->free + 4);
        pPVar8 = (PacketQueueNode *)safemalloc(1,0x58,(size_t)(bpp[-1].in_pq.pqb.end.next + 0x480));
        bpp[-1].out_pq.pqb.end.next = pPVar8;
        (bpp[-1].out_pq.pqb.end.next)->formal_size = 0;
        *(undefined8 *)&(bpp[-1].out_pq.pqb.end.next)->on_free_queue = 0;
        *(undefined4 *)&(bpp[-1].out_pq.pqb.end.next)->next = 0;
        *(undefined1 *)&bpp[-1].out_pq.pqb.end.next[1].prev = 0;
        bpp[-1].in_pq.pqb.ic = (IdempotentCallback *)&bpp[-1].out_pq.pqb.end.next[2].on_free_queue;
        *(undefined4 *)&(bpp[-1].in_pq.pqb.ic)->fn =
             **(undefined4 **)&bpp[-1].in_pq.pqb.end.on_free_queue;
        *stack0xffffffffffffffd8 = 0x1a9;
LAB_00123f97:
        newpayload._4_1_ =
             bufchain_try_fetch_consume
                       (bpp->in_raw,(void *)((long)&(bpp[-1].in_pq.pqb.ic)->fn + 4),
                        (long)bpp[-1].in_pq.pqb.end.next + *(long *)&bpp[-1].input_eof + -4);
        if ((!(bool)newpayload._4_1_) && ((bpp->input_eof & 1U) == 0)) {
          return;
        }
        if ((bool)newpayload._4_1_) {
          ssh_check_frozen(bpp->ssh);
          if ((bpp[-1].out_pq.pqb.ic != (IdempotentCallback *)0x0) &&
             (_Var1 = ssh2_mac_verify((ssh2_mac *)bpp[-1].out_pq.pqb.ic,bpp[-1].in_pq.pqb.ic,
                                      (int)bpp[-1].vt + 4,
                                      *(unsigned_long *)&bpp[-1].out_pq.pqb.end.on_free_queue),
             !_Var1)) {
            ssh_sw_abort(bpp->ssh,"Incorrect MAC received on packet");
            *stack0xffffffffffffffd8 = 0;
            return;
          }
          if (bpp[-1].out_pq.pqb.total_size != 0) {
            ssh_cipher_decrypt((ssh_cipher *)bpp[-1].out_pq.pqb.total_size,
                               (void *)((long)&(bpp[-1].in_pq.pqb.ic)->fn + 4),
                               (int)*(undefined8 *)&bpp[-1].input_eof + -4);
          }
          goto LAB_001243f3;
        }
      }
      goto LAB_00124a61;
    }
    if (bpp[-1].in_pq.pqb.total_size < (ulong)*(uint *)&bpp[-1].in_pq.after) {
      bpp[-1].in_pq.pqb.total_size = (ulong)*(uint *)&bpp[-1].in_pq.after;
      pvVar7 = saferealloc(*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue,
                           bpp[-1].in_pq.pqb.total_size,1);
      *(void **)&bpp[-1].in_pq.pqb.end.on_free_queue = pvVar7;
    }
    *stack0xffffffffffffffd8 = 0x1c2;
LAB_001240ff:
    newpayload._3_1_ =
         bufchain_try_fetch_consume
                   (bpp->in_raw,*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue,
                    (ulong)*(uint *)&bpp[-1].in_pq.after);
    if ((!(bool)newpayload._3_1_) && ((bpp->input_eof & 1U) == 0)) {
      return;
    }
    if (!(bool)newpayload._3_1_) goto LAB_00124a61;
    ssh_check_frozen(bpp->ssh);
    if (bpp[-1].out_pq.pqb.total_size != 0) {
      ssh_cipher_decrypt((ssh_cipher *)bpp[-1].out_pq.pqb.total_size,
                         *(void **)&bpp[-1].in_pq.pqb.end.on_free_queue,*(int *)&bpp[-1].in_pq.after
                        );
    }
    uVar2 = GET_32BIT_MSB_FIRST(*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue);
    iVar3 = toint(uVar2);
    bpp[-1].vt = (BinaryPacketProtocolVtable *)(long)iVar3;
    if ((((long)bpp[-1].vt < 0) || (0x9000 < (long)bpp[-1].vt)) ||
       ((long)((long)&(bpp[-1].vt)->free + 4) % (long)(ulong)*(uint *)&bpp[-1].in_pq.after != 0)) {
      ssh_sw_abort(bpp->ssh,"Incoming packet was garbled on decryption");
      *stack0xffffffffffffffd8 = 0;
      return;
    }
    *(undefined1 **)&bpp[-1].input_eof = (undefined1 *)((long)&(bpp[-1].vt)->free + 4);
    bpp[-1].in_pq.pqb.end.formal_size =
         (long)&(bpp[-1].in_pq.pqb.end.next)->next + *(long *)&bpp[-1].input_eof;
    pPVar8 = (PacketQueueNode *)safemalloc(1,0x58,bpp[-1].in_pq.pqb.end.formal_size);
    bpp[-1].out_pq.pqb.end.next = pPVar8;
    (bpp[-1].out_pq.pqb.end.next)->formal_size = 0;
    *(undefined8 *)&(bpp[-1].out_pq.pqb.end.next)->on_free_queue = 0;
    *(undefined4 *)&(bpp[-1].out_pq.pqb.end.next)->next = 0;
    *(undefined1 *)&bpp[-1].out_pq.pqb.end.next[1].prev = 0;
    bpp[-1].in_pq.pqb.ic = (IdempotentCallback *)&bpp[-1].out_pq.pqb.end.next[2].on_free_queue;
    memcpy(bpp[-1].in_pq.pqb.ic,*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue,
           (ulong)*(uint *)&bpp[-1].in_pq.after);
    *stack0xffffffffffffffd8 = 0x1eb;
LAB_001242cc:
    newpayload._2_1_ =
         bufchain_try_fetch_consume
                   (bpp->in_raw,
                    (void *)((long)&(bpp[-1].in_pq.pqb.ic)->fn +
                            (ulong)*(uint *)&bpp[-1].in_pq.after),
                    (long)bpp[-1].in_pq.pqb.end.next +
                    (*(long *)&bpp[-1].input_eof - (ulong)*(uint *)&bpp[-1].in_pq.after));
    if ((!(bool)newpayload._2_1_) && ((bpp->input_eof & 1U) == 0)) {
      return;
    }
    if (!(bool)newpayload._2_1_) goto LAB_00124a61;
    ssh_check_frozen(bpp->ssh);
    if (bpp[-1].out_pq.pqb.total_size != 0) {
      ssh_cipher_decrypt((ssh_cipher *)bpp[-1].out_pq.pqb.total_size,
                         (void *)((long)&(bpp[-1].in_pq.pqb.ic)->fn +
                                 (ulong)*(uint *)&bpp[-1].in_pq.after),
                         (int)*(undefined8 *)&bpp[-1].input_eof - *(int *)&bpp[-1].in_pq.after);
    }
    if ((bpp[-1].out_pq.pqb.ic != (IdempotentCallback *)0x0) &&
       (_Var1 = ssh2_mac_verify((ssh2_mac *)bpp[-1].out_pq.pqb.ic,bpp[-1].in_pq.pqb.ic,
                                (int)bpp[-1].vt + 4,
                                *(unsigned_long *)&bpp[-1].out_pq.pqb.end.on_free_queue), !_Var1)) {
      ssh_sw_abort(bpp->ssh,"Incorrect MAC received on packet");
      *stack0xffffffffffffffd8 = 0;
      return;
    }
    goto LAB_001243f3;
  }
  _success_3 = (int)bpp[-1].in_pq.pqb.end.next + 0x9000;
  if (bpp[-1].in_pq.pqb.total_size < (ulong)_success_3) {
    bpp[-1].in_pq.pqb.total_size = (ulong)_success_3;
    pvVar7 = saferealloc(*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue,bpp[-1].in_pq.pqb.total_size
                         ,1);
    *(void **)&bpp[-1].in_pq.pqb.end.on_free_queue = pvVar7;
  }
  *stack0xffffffffffffffd8 = 0x149;
LAB_00123a84:
  success_4 = bufchain_try_fetch_consume
                        (bpp->in_raw,*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue,
                         (size_t)bpp[-1].in_pq.pqb.end.next);
  if ((!success_4) && ((bpp->input_eof & 1U) == 0)) {
    return;
  }
  if (success_4) {
    ssh_check_frozen(bpp->ssh);
    *(undefined8 *)&bpp[-1].input_eof = 0;
    ssh2_mac_start((ssh2_mac *)bpp[-1].out_pq.pqb.ic);
    BinarySink_put_uint32
              ((BinarySink *)(bpp[-1].out_pq.pqb.ic)->ctx,
               *(unsigned_long *)&bpp[-1].out_pq.pqb.end.on_free_queue);
    do {
      *stack0xffffffffffffffd8 = 0x152;
LAB_00123b25:
      success_5 = bufchain_try_fetch_consume
                            (bpp->in_raw,
                             (void *)((long)&(bpp[-1].in_pq.pqb.end.next)->next +
                                     *(long *)&bpp[-1].in_pq.pqb.end.on_free_queue +
                                     *(long *)&bpp[-1].input_eof),
                             (ulong)*(uint *)&bpp[-1].in_pq.after);
      if ((!success_5) && ((bpp->input_eof & 1U) == 0)) {
        return;
      }
      if (!success_5) break;
      ssh_check_frozen(bpp->ssh);
      ssh_cipher_decrypt((ssh_cipher *)bpp[-1].out_pq.pqb.total_size,
                         (void *)(*(long *)&bpp[-1].in_pq.pqb.end.on_free_queue +
                                 *(long *)&bpp[-1].input_eof),*(int *)&bpp[-1].in_pq.after);
      BinarySink_put_data((BinarySink *)(bpp[-1].out_pq.pqb.ic)->ctx,
                          (void *)(*(long *)&bpp[-1].in_pq.pqb.end.on_free_queue +
                                  *(long *)&bpp[-1].input_eof),(ulong)*(uint *)&bpp[-1].in_pq.after)
      ;
      *(ulong *)&bpp[-1].input_eof =
           (ulong)*(uint *)&bpp[-1].in_pq.after + *(long *)&bpp[-1].input_eof;
      _Var1 = ssh2_mac_verresult((ssh2_mac *)bpp[-1].out_pq.pqb.ic,
                                 (void *)(*(long *)&bpp[-1].in_pq.pqb.end.on_free_queue +
                                         *(long *)&bpp[-1].input_eof));
      if (_Var1) {
        uVar2 = GET_32BIT_MSB_FIRST(*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue);
        iVar3 = toint(uVar2);
        bpp[-1].vt = (BinaryPacketProtocolVtable *)(long)iVar3;
        if ((BinaryPacketProtocolVtable *)(long)iVar3 ==
            (BinaryPacketProtocolVtable *)(*(long *)&bpp[-1].input_eof + -4)) goto LAB_00123c8f;
      }
      if (0x8fff < *(long *)&bpp[-1].input_eof) {
        ssh_sw_abort(bpp->ssh,"No valid incoming packet found");
        *stack0xffffffffffffffd8 = 0;
        return;
      }
    } while( true );
  }
LAB_00124a61:
  *stack0xffffffffffffffd8 = 0x2c9;
  goto LAB_00124a6d;
LAB_00123c8f:
  bpp[-1].in_pq.pqb.end.formal_size =
       (long)&(bpp[-1].in_pq.pqb.end.next)->next + *(long *)&bpp[-1].input_eof;
  pPVar8 = (PacketQueueNode *)safemalloc(1,0x58,bpp[-1].in_pq.pqb.end.formal_size);
  bpp[-1].out_pq.pqb.end.next = pPVar8;
  (bpp[-1].out_pq.pqb.end.next)->formal_size = 0;
  *(undefined8 *)&(bpp[-1].out_pq.pqb.end.next)->on_free_queue = 0;
  *(undefined4 *)&(bpp[-1].out_pq.pqb.end.next)->next = 0;
  *(undefined1 *)&bpp[-1].out_pq.pqb.end.next[1].prev = 0;
  bpp[-1].in_pq.pqb.ic = (IdempotentCallback *)&bpp[-1].out_pq.pqb.end.next[2].on_free_queue;
  memcpy(bpp[-1].in_pq.pqb.ic,*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue,
         bpp[-1].in_pq.pqb.end.formal_size);
LAB_001243f3:
  bpp[-1].in_raw = (bufchain *)(ulong)*(byte *)((long)&(bpp[-1].in_pq.pqb.ic)->fn + 4);
  if (((long)bpp[-1].in_raw < 4) || ((long)bpp[-1].vt - (long)bpp[-1].in_raw < 1)) {
    ssh_sw_abort(bpp->ssh,"Invalid padding length on received packet");
    *stack0xffffffffffffffd8 = 0;
    return;
  }
  bpp[-1].out_raw = (bufchain *)((long)bpp[-1].vt + (-1 - (long)bpp[-1].in_raw));
  bpp[-1].in_pq.pqb.end.prev = (PacketQueueNode *)((long)&(bpp[-1].out_raw)->head + 5);
  dts_consume((DataTransferStatsDirection *)bpp[-1].out_pq.pqb.end.prev,
              *(unsigned_long *)&bpp[-1].input_eof);
  pPVar8 = *(PacketQueueNode **)&bpp[-1].out_pq.pqb.end.on_free_queue;
  *(undefined1 **)&bpp[-1].out_pq.pqb.end.on_free_queue = (undefined1 *)((long)&pPVar8->next + 1);
  (bpp[-1].out_pq.pqb.end.next)->prev = pPVar8;
  bpp[-1].in_pq.pqb.end.prev =
       (PacketQueueNode *)(*(long *)&bpp[-1].input_eof - (long)bpp[-1].in_raw);
  if ((long)bpp[-1].in_pq.pqb.end.prev < 0) {
    __assert_fail("s->length >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/bpp2.c",
                  0x20f,"void ssh2_bpp_handle_input(BinaryPacketProtocol *)");
  }
  if ((bpp[-1].ic_out_pq.fn != (toplevel_callback_fn_t)0x0) &&
     (_Var1 = ssh_decompressor_decompress
                        ((ssh_decompressor *)bpp[-1].ic_out_pq.fn,
                         (uchar *)((long)&(bpp[-1].in_pq.pqb.ic)->fn + 5),
                         (int)bpp[-1].in_pq.pqb.end.prev + -5,&stack0xffffffffffffffc0,
                         (int *)((long)&old_pktin + 4)), _Var1)) {
    if ((long)bpp[-1].in_pq.pqb.end.formal_size < (long)(old_pktin._4_4_ + 5)) {
      pPVar8 = bpp[-1].out_pq.pqb.end.next;
      bpp[-1].in_pq.pqb.end.formal_size = (long)(old_pktin._4_4_ + 5);
      pPVar9 = (PacketQueueNode *)safemalloc(1,0x58,bpp[-1].in_pq.pqb.end.formal_size);
      bpp[-1].out_pq.pqb.end.next = pPVar9;
      memcpy(bpp[-1].out_pq.pqb.end.next,pPVar8,0x58);
      bpp[-1].in_pq.pqb.ic = (IdempotentCallback *)&bpp[-1].out_pq.pqb.end.next[2].on_free_queue;
      smemclr(pPVar8,(long)&(bpp[-1].in_pq.pqb.end.next)->next + *(long *)&bpp[-1].input_eof);
      safefree(pPVar8);
    }
    bpp[-1].in_pq.pqb.end.prev = (PacketQueueNode *)(long)(old_pktin._4_4_ + 5);
    memcpy((void *)((long)&(bpp[-1].in_pq.pqb.ic)->fn + 5),puStack_40,(long)old_pktin._4_4_);
    safefree(puStack_40);
  }
  if ((long)bpp[-1].in_pq.pqb.end.prev < 6) {
    *(undefined4 *)&(bpp[-1].out_pq.pqb.end.next)->next = 0x100;
    bpp[-1].in_pq.pqb.ic = (IdempotentCallback *)((long)&(bpp[-1].in_pq.pqb.ic)->fn + 5);
    bpp[-1].in_pq.pqb.end.prev = (PacketQueueNode *)0x0;
  }
  else {
    *(uint *)&(bpp[-1].out_pq.pqb.end.next)->next =
         (uint)*(byte *)((long)&(bpp[-1].in_pq.pqb.ic)->fn + 5);
    bpp[-1].in_pq.pqb.ic = (IdempotentCallback *)((long)&(bpp[-1].in_pq.pqb.ic)->fn + 6);
    bpp[-1].in_pq.pqb.end.prev = (PacketQueueNode *)&bpp[-1].in_pq.pqb.end.prev[-1].field_0x1a;
  }
  pPVar8 = bpp[-1].out_pq.pqb.end.next;
  pVar11 = make_ptrlen(bpp[-1].in_pq.pqb.ic,(size_t)bpp[-1].in_pq.pqb.end.prev);
  BinarySource_INIT__((BinarySource *)&pPVar8[1].formal_size,pVar11);
  if (bpp->logctx != (LogContext *)0x0) {
    pls = bpp->pls;
    iVar3 = *(int *)&(bpp[-1].out_pq.pqb.end.next)->next;
    pVar11 = make_ptrlen(bpp[-1].in_pq.pqb.ic,(size_t)bpp[-1].in_pq.pqb.end.prev);
    iVar4 = ssh2_censor_packet(pls,iVar3,false,pVar11,(logblank_t *)local_98);
    ctx = bpp->logctx;
    iVar3 = *(int *)&(bpp[-1].out_pq.pqb.end.next)->next;
    texttype = ssh2_pkt_type(bpp->pls->kctx,bpp->pls->actx,
                             *(int *)&(bpp[-1].out_pq.pqb.end.next)->next);
    log_packet(ctx,0,iVar3,texttype,bpp[-1].in_pq.pqb.ic,(size_t)bpp[-1].in_pq.pqb.end.prev,iVar4,
               (logblank_t *)local_98,(unsigned_long *)&(bpp[-1].out_pq.pqb.end.next)->prev,0,
               (char *)0x0);
  }
  _Var1 = ssh2_bpp_check_unimplemented(bpp,(PktIn *)bpp[-1].out_pq.pqb.end.next);
  if (_Var1) {
    safefree(bpp[-1].out_pq.pqb.end.next);
    bpp[-1].out_pq.pqb.end.next = (PacketQueueNode *)0x0;
  }
  else {
    bpp[-1].out_pq.pqb.end.next[1].next =
         (PacketQueueNode *)
         ((long)bpp[-1].out_pq.pqb.end.next[2].next -
         *(long *)&bpp[-1].out_pq.pqb.end.next[1].on_free_queue);
    pq_base_push(&(bpp->in_pq).pqb,(PacketQueueNode *)&(bpp[-1].out_pq.pqb.end.next)->formal_size);
    iVar3 = *(int *)&(bpp[-1].out_pq.pqb.end.next)->next;
    iVar4._0_1_ = bpp[-1].ext_info_rsa_sha256_ok;
    iVar4._1_1_ = bpp[-1].ext_info_rsa_sha512_ok;
    iVar4._2_1_ = bpp[-1].expect_close;
    iVar4._3_1_ = bpp[-1].field_0xdf;
    bpp[-1].ext_info_rsa_sha256_ok = (_Bool)(char)iVar3;
    bpp[-1].ext_info_rsa_sha512_ok = (_Bool)(char)((uint)iVar3 >> 8);
    bpp[-1].expect_close = (_Bool)(char)((uint)iVar3 >> 0x10);
    bpp[-1].field_0xdf = (char)((uint)iVar3 >> 0x18);
    bpp[-1].out_pq.pqb.end.next = (PacketQueueNode *)0x0;
    if ((bpp[-1].ic_out_pq.field_0x14 & 1) != 0) {
      if (iVar3 != 0x34) {
        ssh_proto_error(bpp->ssh,
                        "Remote side sent SSH2_MSG_EXT_INFO not either preceded by NEWKEYS or followed by USERAUTH_SUCCESS"
                       );
        return;
      }
      bpp[-1].ic_out_pq.field_0x14 = 0;
    }
    if (iVar3 == 0x15) {
      if ((uint)bpp[-1].remote_bugs < 2) {
        bpp[-1].remote_bugs = bpp[-1].remote_bugs + 1;
      }
      bpp[-1].ic_out_pq.field_0x11 = 1;
      *stack0xffffffffffffffd8 = 0x272;
      return;
    }
    if ((iVar3 == 0x34) && ((bpp[-1].ic_out_pq.queued & 1U) == 0)) {
      ssh2_bpp_enable_pending_compression((ssh2_bpp_state *)s_00);
      bpp[-1].ic_out_pq.field_0x13 = 1;
    }
    if ((iVar3 == 7) && ((iVar4 != 0x15 || (bpp[-1].remote_bugs != 1)))) {
      if ((bpp[-1].ic_out_pq.queued & 1U) != 0) {
        ssh_proto_error(bpp->ssh,
                        "Remote side sent SSH2_MSG_EXT_INFO that was not immediately after the initial NEWKEYS"
                       );
        return;
      }
      if ((bpp[-1].remote_bugs != 0) && ((bpp[-1].ic_out_pq.field_0x13 & 1) != 0)) {
        ssh_proto_error(bpp->ssh,"Remote side sent SSH2_MSG_EXT_INFO after USERAUTH_SUCCESS");
        return;
      }
      bpp[-1].ic_out_pq.field_0x14 = 1;
    }
    if (((bpp[-1].ic_out_pq.field_0x12 & 1) != 0) && (iVar3 - 0x32U < 0x14)) {
      bpp[-1].ic_out_pq.field_0x12 = 0;
      queue_idempotent_callback(&bpp->ic_out_pq);
    }
  }
  goto LAB_00123929;
}

Assistant:

static void ssh2_bpp_handle_input(BinaryPacketProtocol *bpp)
{
    struct ssh2_bpp_state *s = container_of(bpp, struct ssh2_bpp_state, bpp);

    crBegin(s->crState);

    while (1) {
        s->maxlen = 0;
        s->length = 0;
        if (s->in.cipher)
            s->cipherblk = ssh_cipher_alg(s->in.cipher)->blksize;
        else
            s->cipherblk = 8;
        if (s->cipherblk < 8)
            s->cipherblk = 8;
        s->maclen = s->in.mac ? ssh2_mac_alg(s->in.mac)->len : 0;

        if (s->in.cipher &&
            (ssh_cipher_alg(s->in.cipher)->flags & SSH_CIPHER_IS_CBC) &&
            s->in.mac && !s->in.etm_mode) {
            /*
             * When dealing with a CBC-mode cipher, we want to avoid the
             * possibility of an attacker's tweaking the ciphertext stream
             * so as to cause us to feed the same block to the block
             * cipher more than once and thus leak information
             * (VU#958563).  The way we do this is not to take any
             * decisions on the basis of anything we've decrypted until
             * we've verified it with a MAC.  That includes the packet
             * length, so we just read data and check the MAC repeatedly,
             * and when the MAC passes, see if the length we've got is
             * plausible.
             *
             * This defence is unnecessary in OpenSSH ETM mode, because
             * the whole point of ETM mode is that the attacker can't
             * tweak the ciphertext stream at all without the MAC
             * detecting it before we decrypt anything.
             */

            /*
             * Make sure we have buffer space for a maximum-size packet.
             */
            unsigned buflimit = OUR_V2_PACKETLIMIT + s->maclen;
            if (s->bufsize < buflimit) {
                s->bufsize = buflimit;
                s->buf = sresize(s->buf, s->bufsize, unsigned char);
            }

            /* Read an amount corresponding to the MAC. */
            BPP_READ(s->buf, s->maclen);

            s->packetlen = 0;
            ssh2_mac_start(s->in.mac);
            put_uint32(s->in.mac, s->in.sequence);

            for (;;) { /* Once around this loop per cipher block. */
                /* Read another cipher-block's worth, and tack it on to
                 * the end. */
                BPP_READ(s->buf + (s->packetlen + s->maclen), s->cipherblk);
                /* Decrypt one more block (a little further back in
                 * the stream). */
                ssh_cipher_decrypt(s->in.cipher,
                                   s->buf + s->packetlen, s->cipherblk);

                /* Feed that block to the MAC. */
                put_data(s->in.mac,
                         s->buf + s->packetlen, s->cipherblk);
                s->packetlen += s->cipherblk;

                /* See if that gives us a valid packet. */
                if (ssh2_mac_verresult(s->in.mac, s->buf + s->packetlen) &&
                    ((s->len = toint(GET_32BIT_MSB_FIRST(s->buf))) ==
                     s->packetlen-4))
                    break;
                if (s->packetlen >= (long)OUR_V2_PACKETLIMIT) {
                    ssh_sw_abort(s->bpp.ssh,
                                 "No valid incoming packet found");
                    crStopV;
                }
            }
            s->maxlen = s->packetlen + s->maclen;

            /*
             * Now transfer the data into an output packet.
             */
            s->pktin = snew_plus(PktIn, s->maxlen);
            s->pktin->qnode.prev = s->pktin->qnode.next = NULL;
            s->pktin->type = 0;
            s->pktin->qnode.on_free_queue = false;
            s->data = snew_plus_get_aux(s->pktin);
            memcpy(s->data, s->buf, s->maxlen);
        } else if (s->in.mac && s->in.etm_mode) {
            if (s->bufsize < 4) {
                s->bufsize = 4;
                s->buf = sresize(s->buf, s->bufsize, unsigned char);
            }

            /*
             * OpenSSH encrypt-then-MAC mode: the packet length is
             * unencrypted, unless the cipher supports length encryption.
             */
            BPP_READ(s->buf, 4);

            /* Cipher supports length decryption, so do it */
            if (s->in.cipher && (ssh_cipher_alg(s->in.cipher)->flags &
                                 SSH_CIPHER_SEPARATE_LENGTH)) {
                /* Keep the packet the same though, so the MAC passes */
                unsigned char len[4];
                memcpy(len, s->buf, 4);
                ssh_cipher_decrypt_length(
                    s->in.cipher, len, 4, s->in.sequence);
                s->len = toint(GET_32BIT_MSB_FIRST(len));
            } else {
                s->len = toint(GET_32BIT_MSB_FIRST(s->buf));
            }

            /*
             * _Completely_ silly lengths should be stomped on before they
             * do us any more damage.
             */
            if (s->len < 0 || s->len > (long)OUR_V2_PACKETLIMIT ||
                s->len % s->cipherblk != 0) {
                ssh_sw_abort(s->bpp.ssh,
                             "Incoming packet length field was garbled");
                crStopV;
            }

            /*
             * So now we can work out the total packet length.
             */
            s->packetlen = s->len + 4;

            /*
             * Allocate the packet to return, now we know its length.
             */
            s->pktin = snew_plus(PktIn, OUR_V2_PACKETLIMIT + s->maclen);
            s->pktin->qnode.prev = s->pktin->qnode.next = NULL;
            s->pktin->type = 0;
            s->pktin->qnode.on_free_queue = false;
            s->data = snew_plus_get_aux(s->pktin);
            memcpy(s->data, s->buf, 4);

            /*
             * Read the remainder of the packet.
             */
            BPP_READ(s->data + 4, s->packetlen + s->maclen - 4);

            /*
             * Check the MAC.
             */
            if (s->in.mac && !ssh2_mac_verify(
                    s->in.mac, s->data, s->len + 4, s->in.sequence)) {
                ssh_sw_abort(s->bpp.ssh, "Incorrect MAC received on packet");
                crStopV;
            }

            /* Decrypt everything between the length field and the MAC. */
            if (s->in.cipher)
                ssh_cipher_decrypt(
                    s->in.cipher, s->data + 4, s->packetlen - 4);
        } else {
            if (s->bufsize < s->cipherblk) {
                s->bufsize = s->cipherblk;
                s->buf = sresize(s->buf, s->bufsize, unsigned char);
            }

            /*
             * Acquire and decrypt the first block of the packet. This will
             * contain the length and padding details.
             */
            BPP_READ(s->buf, s->cipherblk);

            if (s->in.cipher)
                ssh_cipher_decrypt(s->in.cipher, s->buf, s->cipherblk);

            /*
             * Now get the length figure.
             */
            s->len = toint(GET_32BIT_MSB_FIRST(s->buf));

            /*
             * _Completely_ silly lengths should be stomped on before they
             * do us any more damage.
             */
            if (s->len < 0 || s->len > (long)OUR_V2_PACKETLIMIT ||
                (s->len + 4) % s->cipherblk != 0) {
                ssh_sw_abort(s->bpp.ssh,
                             "Incoming packet was garbled on decryption");
                crStopV;
            }

            /*
             * So now we can work out the total packet length.
             */
            s->packetlen = s->len + 4;

            /*
             * Allocate the packet to return, now we know its length.
             */
            s->maxlen = s->packetlen + s->maclen;
            s->pktin = snew_plus(PktIn, s->maxlen);
            s->pktin->qnode.prev = s->pktin->qnode.next = NULL;
            s->pktin->type = 0;
            s->pktin->qnode.on_free_queue = false;
            s->data = snew_plus_get_aux(s->pktin);
            memcpy(s->data, s->buf, s->cipherblk);

            /*
             * Read and decrypt the remainder of the packet.
             */
            BPP_READ(s->data + s->cipherblk,
                     s->packetlen + s->maclen - s->cipherblk);

            /* Decrypt everything _except_ the MAC. */
            if (s->in.cipher)
                ssh_cipher_decrypt(
                    s->in.cipher,
                    s->data + s->cipherblk, s->packetlen - s->cipherblk);

            /*
             * Check the MAC.
             */
            if (s->in.mac && !ssh2_mac_verify(
                    s->in.mac, s->data, s->len + 4, s->in.sequence)) {
                ssh_sw_abort(s->bpp.ssh, "Incorrect MAC received on packet");
                crStopV;
            }
        }
        /* Get and sanity-check the amount of random padding. */
        s->pad = s->data[4];
        if (s->pad < 4 || s->len - s->pad < 1) {
            ssh_sw_abort(s->bpp.ssh,
                         "Invalid padding length on received packet");
            crStopV;
        }
        /*
         * This enables us to deduce the payload length.
         */
        s->payload = s->len - s->pad - 1;

        s->length = s->payload + 5;

        dts_consume(&s->stats->in, s->packetlen);

        s->pktin->sequence = s->in.sequence++;

        s->length = s->packetlen - s->pad;
        assert(s->length >= 0);

        /*
         * Decompress packet payload.
         */
        {
            unsigned char *newpayload;
            int newlen;
            if (s->in_decomp && ssh_decompressor_decompress(
                    s->in_decomp, s->data + 5, s->length - 5,
                    &newpayload, &newlen)) {
                if (s->maxlen < newlen + 5) {
                    PktIn *old_pktin = s->pktin;

                    s->maxlen = newlen + 5;
                    s->pktin = snew_plus(PktIn, s->maxlen);
                    *s->pktin = *old_pktin; /* structure copy */
                    s->data = snew_plus_get_aux(s->pktin);

                    smemclr(old_pktin, s->packetlen + s->maclen);
                    sfree(old_pktin);
                }
                s->length = 5 + newlen;
                memcpy(s->data + 5, newpayload, newlen);
                sfree(newpayload);
            }
        }

        /*
         * Now we can identify the semantic content of the packet,
         * and also the initial type byte.
         */
        if (s->length <= 5) { /* == 5 we hope, but robustness */
            /*
             * RFC 4253 doesn't explicitly say that completely empty
             * packets with no type byte are forbidden. We handle them
             * here by giving them a type code larger than 0xFF, which
             * will be picked up at the next layer and trigger
             * SSH_MSG_UNIMPLEMENTED.
             */
            s->pktin->type = SSH_MSG_NO_TYPE_CODE;
            s->data += 5;
            s->length = 0;
        } else {
            s->pktin->type = s->data[5];
            s->data += 6;
            s->length -= 6;
        }
        BinarySource_INIT(s->pktin, s->data, s->length);

        if (s->bpp.logctx) {
            logblank_t blanks[MAX_BLANKS];
            int nblanks = ssh2_censor_packet(
                s->bpp.pls, s->pktin->type, false,
                make_ptrlen(s->data, s->length), blanks);
            log_packet(s->bpp.logctx, PKT_INCOMING, s->pktin->type,
                       ssh2_pkt_type(s->bpp.pls->kctx, s->bpp.pls->actx,
                                     s->pktin->type),
                       s->data, s->length, nblanks, blanks,
                       &s->pktin->sequence, 0, NULL);
        }

        if (ssh2_bpp_check_unimplemented(&s->bpp, s->pktin)) {
            sfree(s->pktin);
            s->pktin = NULL;
            continue;
        }

        s->pktin->qnode.formal_size = get_avail(s->pktin);
        pq_push(&s->bpp.in_pq, s->pktin);

        {
            int type = s->pktin->type;
            int prev_type = s->prev_type;
            s->prev_type = type;
            s->pktin = NULL;

            if (s->enforce_next_packet_is_userauth_success) {
                /* See EXT_INFO handler below */
                if (type != SSH2_MSG_USERAUTH_SUCCESS) {
                    ssh_proto_error(s->bpp.ssh,
                                    "Remote side sent SSH2_MSG_EXT_INFO "
                                    "not either preceded by NEWKEYS or "
                                    "followed by USERAUTH_SUCCESS");
                    return;
                }
                s->enforce_next_packet_is_userauth_success = false;
            }

            if (type == SSH2_MSG_NEWKEYS) {
                if (s->nnewkeys < 2)
                    s->nnewkeys++;
                /*
                 * Mild layer violation: in this situation we must
                 * suspend processing of the input byte stream until
                 * the transport layer has initialised the new keys by
                 * calling ssh2_bpp_new_incoming_crypto above.
                 */
                s->pending_newkeys = true;
                crWaitUntilV(!s->pending_newkeys);
                continue;
            }

            if (type == SSH2_MSG_USERAUTH_SUCCESS && !s->is_server) {
                /*
                 * Another one: if we were configured with OpenSSH's
                 * deferred compression which is triggered on receipt
                 * of USERAUTH_SUCCESS, then this is the moment to
                 * turn on compression.
                 */
                ssh2_bpp_enable_pending_compression(s);

                /*
                 * Whether or not we were doing delayed compression in
                 * _this_ set of crypto parameters, we should set a
                 * flag indicating that we're now authenticated, so
                 * that a delayed compression method enabled in any
                 * future rekey will be treated as un-delayed.
                 */
                s->seen_userauth_success = true;
            }

            if (type == SSH2_MSG_EXT_INFO) {
                /*
                 * And another: enforce that an incoming EXT_INFO is
                 * either the message immediately after the initial
                 * NEWKEYS, or (if we're the client) the one
                 * immediately before USERAUTH_SUCCESS.
                 */
                if (prev_type == SSH2_MSG_NEWKEYS && s->nnewkeys == 1) {
                    /* OK - this is right after the first NEWKEYS. */
                } else if (s->is_server) {
                    /* We're the server, so they're the client.
                     * Clients may not send EXT_INFO at _any_ other
                     * time. */
                    ssh_proto_error(s->bpp.ssh,
                                    "Remote side sent SSH2_MSG_EXT_INFO "
                                    "that was not immediately after the "
                                    "initial NEWKEYS");
                    return;
                } else if (s->nnewkeys > 0 && s->seen_userauth_success) {
                    /* We're the client, so they're the server. In
                     * that case they may also send EXT_INFO
                     * immediately before USERAUTH_SUCCESS. Error out
                     * immediately if this can't _possibly_ be that
                     * moment (because we haven't even seen NEWKEYS
                     * yet, or because we've already seen
                     * USERAUTH_SUCCESS). */
                    ssh_proto_error(s->bpp.ssh,
                                    "Remote side sent SSH2_MSG_EXT_INFO "
                                    "after USERAUTH_SUCCESS");
                    return;
                } else {
                    /* This _could_ be OK, provided the next packet is
                     * USERAUTH_SUCCESS. Set a flag to remember to
                     * fault it if not. */
                    s->enforce_next_packet_is_userauth_success = true;
                }
            }

            if (s->pending_compression && userauth_range(type)) {
                /*
                 * Receiving any userauth message at all indicates
                 * that we're not about to turn on delayed compression
                 * - either because we just _have_ done, or because
                 * this message is a USERAUTH_FAILURE or some kind of
                 * intermediate 'please send more data' continuation
                 * message. Either way, we turn off the outgoing
                 * packet blockage for now, and release any queued
                 * output packets, so that we can make another attempt
                 * to authenticate. The next userauth packet we send
                 * will re-block the output direction.
                 */
                s->pending_compression = false;
                queue_idempotent_callback(&s->bpp.ic_out_pq);
            }
        }
    }

  eof:
    /*
     * We've seen EOF. But we might have pushed stuff on the outgoing
     * packet queue first, and that stuff _might_ include a DISCONNECT
     * message, in which case we'd like to use that as the diagnostic.
     * So first wait for the queue to have been processed.
     */
    crMaybeWaitUntilV(!pq_peek(&s->bpp.in_pq));
    if (!s->bpp.expect_close) {
        ssh_remote_error(s->bpp.ssh,
                         "Remote side unexpectedly closed network connection");
    } else {
        ssh_remote_eof(s->bpp.ssh, "Remote side closed network connection");
    }
    return;  /* avoid touching s now it's been freed */

    crFinishV;
}